

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall wasm::Literal::internalize(Literal *__return_storage_ptr__,Literal *this)

{
  bool bVar1;
  element_type *peVar2;
  Literal *pLVar3;
  shared_ptr<wasm::GCData> local_78;
  BasicHeapType local_64;
  HeapType local_60;
  BasicHeapType local_58 [4];
  HeapType local_48;
  shared_ptr<wasm::GCData> local_40;
  HeapType local_30;
  Type local_28;
  Type local_20;
  Literal *local_18;
  Literal *this_local;
  
  local_20.id = (this->type).id;
  local_18 = this;
  this_local = __return_storage_ptr__;
  HeapType::HeapType(&local_30,ext);
  wasm::Type::Type(&local_28,local_30,Nullable);
  bVar1 = wasm::Type::isSubType(local_20,local_28);
  if (!bVar1) {
    __assert_fail("Type::isSubType(type, Type(HeapType::ext, Nullable)) && \"can only internalize external references\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                  ,0xa3e,"Literal wasm::Literal::internalize() const");
  }
  bVar1 = isNull(this);
  if (bVar1) {
    std::shared_ptr<wasm::GCData>::shared_ptr(&local_40);
    HeapType::HeapType(&local_48,none);
    Literal(__return_storage_ptr__,&local_40,local_48);
    std::shared_ptr<wasm::GCData>::~shared_ptr(&local_40);
  }
  else {
    peVar2 = std::__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    local_58[0] = i31;
    bVar1 = HeapType::operator==(&peVar2->type,local_58);
    if (bVar1) {
      peVar2 = std::__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      pLVar3 = SmallVector<wasm::Literal,_1UL>::operator[]
                         (&(peVar2->values).super_SmallVector<wasm::Literal,_1UL>,0);
      local_60 = wasm::Type::getHeapType(&pLVar3->type);
      local_64 = i31;
      bVar1 = HeapType::operator==(&local_60,&local_64);
      if (!bVar1) {
        __assert_fail("gcData->values[0].type.getHeapType() == HeapType::i31",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                      ,0xa43,"Literal wasm::Literal::internalize() const");
      }
      peVar2 = std::__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      pLVar3 = SmallVector<wasm::Literal,_1UL>::operator[]
                         (&(peVar2->values).super_SmallVector<wasm::Literal,_1UL>,0);
      Literal(__return_storage_ptr__,pLVar3);
    }
    else {
      std::shared_ptr<wasm::GCData>::shared_ptr(&local_78,(shared_ptr<wasm::GCData> *)this);
      peVar2 = std::__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      Literal(__return_storage_ptr__,&local_78,(HeapType)(peVar2->type).id);
      std::shared_ptr<wasm::GCData>::~shared_ptr(&local_78);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::internalize() const {
  assert(Type::isSubType(type, Type(HeapType::ext, Nullable)) &&
         "can only internalize external references");
  if (isNull()) {
    return Literal(std::shared_ptr<GCData>{}, HeapType::none);
  }
  if (gcData->type == HeapType::i31) {
    assert(gcData->values[0].type.getHeapType() == HeapType::i31);
    return gcData->values[0];
  }
  return Literal(gcData, gcData->type);
}